

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void prepbitfield(rnndb *db,rnnbitfield *bf,char *prefix,rnnvarinfo *parvi)

{
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  
  pcVar2 = catstr(prefix,bf->name);
  bf->fullname = pcVar2;
  prepvarinfo(db,pcVar2,&bf->varinfo,parvi);
  if ((bf->varinfo).dead == 0) {
    iVar1 = bf->high;
    if (iVar1 == 0x3f) {
      uVar3 = -1L << ((byte)bf->low & 0x3f);
    }
    else {
      uVar3 = (-1L << ((byte)bf->low & 0x3f)) + (1L << ((char)iVar1 + 1U & 0x3f));
    }
    bf->mask = uVar3;
    preptypeinfo(db,&bf->typeinfo,bf->fullname,&bf->varinfo,(iVar1 - bf->low) + 1,bf->file);
    pcVar2 = (bf->varinfo).prefix;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = catstr(pcVar2,bf->fullname);
      bf->fullname = pcVar2;
    }
  }
  return;
}

Assistant:

static void prepbitfield(struct rnndb *db, struct rnnbitfield *bf, char *prefix, struct rnnvarinfo *parvi) {
	bf->fullname = catstr(prefix, bf->name);
	prepvarinfo (db, bf->fullname, &bf->varinfo, parvi);
	if (bf->varinfo.dead)
		return;
	if (bf->high == 63)
		bf->mask = - (1ULL<<bf->low);
	else
		bf->mask = (1ULL<<(bf->high+1)) - (1ULL<<bf->low);
	preptypeinfo(db, &bf->typeinfo, bf->fullname, &bf->varinfo, bf->high - bf->low + 1, bf->file);
	if (bf->varinfo.prefix)
		bf->fullname = catstr(bf->varinfo.prefix, bf->fullname);
}